

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O1

bool __thiscall
ObjectModelBuilder::buildProperty(ObjectModelBuilder *this,string *propertyString,Class *clazz)

{
  string *__return_storage_ptr__;
  long lVar1;
  ostream *poVar2;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 local_98 [8];
  Property property;
  string prop;
  
  __return_storage_ptr__ = (string *)(property.type.field_2._M_local_buf + 8);
  string_trim(__return_storage_ptr__,propertyString);
  lVar1 = std::__cxx11::string::find_last_of
                    ((char *)__return_storage_ptr__,0x11ce84,0xffffffffffffffff);
  if (lVar1 == -1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"error: invalid property: ",0x19);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)property.type.field_2._8_8_,
                        (long)prop._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," in class: ",0xb);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(clazz->name)._M_dataplus._M_p,(clazz->name)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  else {
    property.clazz = (Class *)&property.name._M_string_length;
    property.name._M_dataplus._M_p = (pointer)0x0;
    property.name._M_string_length._0_1_ = 0;
    property.name.field_2._8_8_ = &property.type._M_string_length;
    property.type._M_dataplus._M_p = (pointer)0x0;
    property.type._M_string_length._0_1_ = 0;
    local_98 = (undefined1  [8])clazz;
    std::__cxx11::string::substr((ulong)local_b8,(ulong)((long)&property.type.field_2 + 8));
    std::__cxx11::string::operator=
              ((string *)(property.name.field_2._M_local_buf + 8),(string *)local_b8);
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0]);
    }
    std::__cxx11::string::substr((ulong)local_b8,(ulong)((long)&property.type.field_2 + 8));
    std::__cxx11::string::operator=((string *)&property,(string *)local_b8);
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0]);
    }
    std::vector<Property,_std::allocator<Property>_>::push_back
              (&clazz->properties,(value_type *)local_98);
    if (this->m_verbose == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," - property: type=\'",0x13);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)property.name.field_2._8_8_,
                          (long)property.type._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\', name=\'",9);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(char *)property.clazz,(long)property.name._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
    if ((size_type *)property.name.field_2._8_8_ != &property.type._M_string_length) {
      operator_delete((void *)property.name.field_2._8_8_);
    }
    if (property.clazz != (Class *)&property.name._M_string_length) {
      operator_delete(property.clazz);
    }
  }
  if ((size_type *)property.type.field_2._8_8_ != &prop._M_string_length) {
    operator_delete((void *)property.type.field_2._8_8_);
  }
  return lVar1 != -1;
}

Assistant:

bool ObjectModelBuilder::buildProperty(const std::string &propertyString, Class *clazz)
{
    std::string prop = string_trim(propertyString);
    size_t space = prop.find_last_of(" ");
    if (space == std::string::npos) {
        std::cerr << "error: invalid property: " << prop << " in class: " << clazz->name << std::endl;
        return false;
    }
    Property property;
    property.clazz = clazz;
    property.type = prop.substr(0, space);
    property.name = prop.substr(space+1);

    clazz->properties.push_back(property);

    if (m_verbose)
        std::cerr << " - property: type='" << property.type << "', name='" << property.name << "'" << std::endl;

    return true;
}